

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
* __thiscall
Graph::paths(vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
             *__return_storage_ptr__,Graph *this,Edge *start,Edge *stop)

{
  pointer ppEVar1;
  Edge *this_00;
  void *pvVar2;
  bool bVar3;
  int vertex;
  Edge *pEVar4;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *__range3;
  pointer ppEVar5;
  uint uVar6;
  vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_> dfsStack;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> finishedPath;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_a8;
  pair<int,_const_Edge_*> *local_88;
  iterator iStack_80;
  pair<int,_const_Edge_*> *local_78;
  vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  *local_70;
  undefined8 local_68;
  Edge *apEStack_60 [2];
  pair<int,_const_Edge_*> local_50;
  long local_40;
  Edge *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = (pair<int,_const_Edge_*> *)0x0;
  local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_88 = (pair<int,_const_Edge_*> *)0x0;
  iStack_80._M_current = (pair<int,_const_Edge_*> *)0x0;
  local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)start;
  local_70 = __return_storage_ptr__;
  local_38 = stop;
  std::vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>>::
  _M_realloc_insert<std::pair<int,Edge_const*>>
            ((vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>> *)
             &local_88,(iterator)0x0,(pair<int,_const_Edge_*> *)&local_a8);
  local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Edge **)0x0;
  local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iStack_80._M_current != local_88) {
    uVar6 = 0;
    do {
      local_68 = *(undefined8 *)(iStack_80._M_current + -1);
      apEStack_60[0] = iStack_80._M_current[-1].second;
      iStack_80._M_current = iStack_80._M_current + -1;
      if ((int)(uint)local_68 < (int)uVar6) {
        local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_a8.
                             super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl
                             .super__Vector_impl_data._M_finish +
                      (ulong)(uVar6 + ~(uint)local_68) * -8 + -8);
        uVar6 = (uint)local_68;
      }
      if (local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        vertex = -1;
      }
      else {
        vertex = Edge::sharedVertex(apEStack_60[0],
                                    (Edge *)(((Edge *)((long)local_a8.
                                                  super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + -0x30
                                                  ))->neighbours).
                                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Edge_const*,std::allocator<Edge_const*>>::_M_realloc_insert<Edge_const*const&>
                  ((vector<Edge_const*,std::allocator<Edge_const*>> *)&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,apEStack_60);
      }
      else {
        *local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
         super__Vector_impl_data._M_finish = apEStack_60[0];
        local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar6 = uVar6 + 1;
      if (apEStack_60[0] == local_38) {
        std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
                  ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)&local_50,&local_a8);
        std::
        vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
        ::push_back(local_70,(value_type *)&local_50);
        pvVar2 = (void *)CONCAT44(local_50._4_4_,local_50.first);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,local_40 - (long)pvVar2);
        }
      }
      else {
        ppEVar1 = (apEStack_60[0]->neighbours).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar5 = (apEStack_60[0]->neighbours).
                       super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                       super__Vector_impl_data._M_start; ppEVar5 != ppEVar1; ppEVar5 = ppEVar5 + 1)
        {
          this_00 = *ppEVar5;
          bVar3 = Edge::connectsTo(this_00,vertex);
          pEVar4 = (Edge *)local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
          if (!bVar3) {
            for (; pEVar4 != (Edge *)local_a8.
                                     super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                pEVar4 = (Edge *)&pEVar4->to) {
              if (*(Edge **)pEVar4 == this_00) goto LAB_0010ba20;
            }
            local_50.first = uVar6;
            local_50.second = this_00;
            if (iStack_80._M_current == local_78) {
              std::vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>>::
              _M_realloc_insert<std::pair<int,Edge_const*>>
                        ((vector<std::pair<int,Edge_const*>,std::allocator<std::pair<int,Edge_const*>>>
                          *)&local_88,iStack_80,&local_50);
            }
            else {
              *(ulong *)iStack_80._M_current = CONCAT44(local_50._4_4_,uVar6);
              (iStack_80._M_current)->second = this_00;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
LAB_0010ba20:
        }
      }
    } while (iStack_80._M_current != local_88);
    if ((Edge *)local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start != (Edge *)0x0) {
      operator_delete(local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_88 != (pair<int,_const_Edge_*> *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return local_70;
}

Assistant:

std::vector<std::vector<const Edge*>> Graph::paths(const Edge* start, const Edge* stop) {
  std::vector<std::vector<const Edge*>> paths;
  std::vector<std::pair<int, const Edge*>> dfsStack; //store depth at which edge has been found to know how often we need to backtrack
  dfsStack.push_back({0, start});
  std::vector<const Edge*> currPath;
  int dfsDepth = 0;
 
  while(dfsStack.size() > 0) {
    auto [curDepth, currEdge] = dfsStack.back();
    dfsStack.pop_back();
    while(dfsDepth > curDepth) {
      currPath.pop_back();
      dfsDepth--;
    }
    dfsDepth++;

    int sharedNode = -1;
    if(currPath.size() > 0) {
      const Edge* prev = currPath.back();
      sharedNode = currEdge->sharedVertex(prev);
      
    }
    currPath.push_back(currEdge);
    
    if(currEdge == stop) { //finnished path
      std::vector<const Edge*> finishedPath(currPath);
      paths.push_back(finishedPath);
      continue;
    }

    for(const Edge* neighbour: currEdge->neighbours) {
      bool onPath = false;

      //cant make sudden turns in a fork
      if(neighbour->connectsTo(sharedNode)) {
        continue;
      }
      
      for(const Edge* pathEdge: currPath) {
        if(pathEdge == neighbour) {
          onPath = true;
          break;
        }
      }
      if(onPath)
        continue;
      
      dfsStack.push_back({dfsDepth, neighbour});
    }
  }
  return paths;
}